

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type,
          bool should_consider_suffix)

{
  BaseType BVar1;
  StructDef *def;
  char *pcVar2;
  char *pcVar3;
  Type local_28;
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_STRUCT) {
    def = type->struct_def;
    if ((should_consider_suffix) && (def->fixed == false)) {
      IdlNamer::NamespacedObjectType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&def->super_Definition);
    }
    else {
      IdlNamer::NamespacedType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&def->super_Definition);
    }
  }
  else if (BVar1 == BASE_TYPE_VECTOR) {
    local_28.base_type = type->element;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    GenType_abi_cxx11_(__return_storage_ptr__,this,&local_28,false);
  }
  else {
    if (BVar1 == BASE_TYPE_STRING) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "String";
      pcVar2 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "FlatbuffersInitializable";
      pcVar2 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypePointer(const Type &type,
                             const bool should_consider_suffix) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: {
        const auto &sd = *type.struct_def;
        if (should_consider_suffix && !sd.fixed) {
          return namer_.NamespacedObjectType(sd);
        }
        return namer_.NamespacedType(sd);
      }
      case BASE_TYPE_UNION:
      default: return "FlatbuffersInitializable";
    }
  }